

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool pendingDispose)

{
  ushort uVar1;
  undefined4 *puVar2;
  FreeObject *pFVar3;
  char *pcVar4;
  code *pcVar5;
  anon_class_32_4_66517344 fn;
  SmallHeapBlockBitVector *this_00;
  bool bVar6;
  BOOLEAN BVar7;
  ushort uVar8;
  int iVar9;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar10;
  FreeObject *pFVar11;
  HeapBlock *pHVar12;
  undefined4 extraout_var;
  byte *pbVar13;
  undefined7 in_register_00000031;
  uint cond;
  uint uVar14;
  BVIndex i_00;
  FreeObject *this_01;
  uint i;
  uint index;
  undefined8 *in_FS_OFFSET;
  undefined1 local_278 [8];
  SmallHeapBlockBitVector tempFree;
  SmallHeapBlockBitVector tempPending;
  SmallHeapBlockBitVector *local_48;
  SmallHeapBlockBitVector *free;
  uint local_38;
  ushort local_32 [4];
  ushort verifyFinalizeCount;
  
  local_32[0] = 0;
  memset((SmallHeapBlockBitVector *)local_278,0,0x100);
  local_48 = (SmallHeapBlockBitVector *)local_278;
  memset(tempFree.data + 0x1f,0,0x100);
  BuildFreeBitVector(this,(SmallHeapBlockBitVector *)local_278);
  this_01 = (FreeObject *)(this->super_HeapBlock).address;
  free = (SmallHeapBlockBitVector *)this->heapBucket->heapInfo->recycler;
  uVar1 = this->objectSize;
  if ((int)CONCAT71(in_register_00000031,pendingDispose) == 0) {
    uVar14 = 1;
    pFVar11 = this_01;
  }
  else {
    bVar6 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock);
    uVar14 = (uint)bVar6;
    pFVar11 = (FreeObject *)(this->super_HeapBlock).address;
  }
  Recycler::VerifyCheck
            (uVar14,L"Non-finalizable block shouldn\'t be disposing. May have corrupted block type."
             ,pFVar11,&(this->super_HeapBlock).heapBlockType);
  bVar6 = HasPendingDisposeObjects(this);
  if (bVar6) {
    if (!pendingDispose) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x825,"(pendingDispose)","pendingDispose");
      if (!bVar6) goto LAB_00232aca;
      *puVar2 = 0;
    }
    pSVar10 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    fn.free = &local_48;
    fn.this = this;
    fn.tempPending = (SmallHeapBlockBitVector *)(tempFree.data + 0x1f);
    fn.verifyFinalizeCount = local_32;
    SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(bool)::_lambda(unsigned_int)_1_>
              (pSVar10,fn);
  }
  uVar14 = (uint)(uVar1 >> 4);
  i_00 = 0;
  local_38 = uVar14;
  for (index = 0; index < this->objectCount; index = index + 1) {
    BVar7 = BVStatic<2048UL>::Test(local_48,i_00);
    if (BVar7 == '\0') {
      BVar7 = BVStatic<2048UL>::Test(&this->explicitFreeBits,i_00);
      if (BVar7 == '\0') {
        Recycler::VerifyCheckPad((Recycler *)free,this_01,(ulong)this->objectSize);
      }
      else {
        pFVar11 = FreeObject::GetNext(this_01);
        uVar14 = 1;
        if (pFVar11 != (FreeObject *)0x0) {
          pHVar12 = Recycler::FindHeapBlock((Recycler *)free,pFVar11);
          pFVar3 = (FreeObject *)(this->super_HeapBlock).address;
          if (pFVar11 < pFVar3 + 0x1000 && pFVar3 <= pFVar11) {
            uVar8 = GetAddressBitIndex(pFVar11);
            BVar7 = BVStatic<2048UL>::Test(&this->explicitFreeBits,(uint)uVar8);
            uVar14 = 1;
            if (BVar7 != '\0') goto LAB_00232984;
          }
          iVar9 = (*pHVar12->_vptr_HeapBlock[9])(pHVar12,pFVar11);
          uVar14 = (uint)(CONCAT44(extraout_var,iVar9) == (ulong)this->objectSize);
        }
LAB_00232984:
        Recycler::VerifyCheck
                  (uVar14,L"SmallHeapBlock memory written to after freed",this_01,this_01);
        Recycler::VerifyCheckPadExplicitFreeList((Recycler *)free,this_01,(ulong)this->objectSize);
        uVar14 = local_38;
      }
      pbVar13 = ObjectInfo(this,index);
      if ((char)*pbVar13 < '\0') {
        bVar6 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock);
        if (bVar6) {
          local_32[0] = local_32[0] + 1;
        }
        else {
          pcVar4 = (this->super_HeapBlock).address;
          pbVar13 = ObjectInfo(this,index);
          uVar14 = local_38;
          Recycler::VerifyCheck
                    (0,L"Non-Finalizable block should not have finalizable objects",pcVar4,pbVar13);
        }
      }
    }
    else {
      BVar7 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)(tempFree.data + 0x1f),i_00);
      if (BVar7 == '\0') {
        pFVar11 = FreeObject::GetNext(this_01);
        this_00 = local_48;
        cond = 1;
        if ((pFVar11 != (FreeObject *)0x0) &&
           (pFVar3 = (FreeObject *)(this->super_HeapBlock).address, cond = 0,
           pFVar11 < pFVar3 + 0x1000 && pFVar3 <= pFVar11)) {
          uVar8 = GetAddressBitIndex(pFVar11);
          uVar14 = local_38;
          BVar7 = BVStatic<2048UL>::Test(this_00,(uint)uVar8);
          cond = (uint)(BVar7 != '\0');
        }
        Recycler::VerifyCheck(cond,L"SmallHeapBlock memory written to after freed",this_01,this_01);
        Recycler::VerifyCheckFill(this_01 + 1,(ulong)this->objectSize - 8);
      }
    }
    this_01 = (FreeObject *)((long)&this_01->taggedNext + (ulong)this->objectSize);
    i_00 = i_00 + uVar14;
  }
  bVar6 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock);
  if (bVar6) {
    pSVar10 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    bVar6 = pSVar10->finalizeCount == local_32[0];
    pcVar4 = (this->super_HeapBlock).address;
    pSVar10 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    Recycler::VerifyCheck
              ((uint)bVar6,L"SmallHeapBlock finalize count mismatch",pcVar4,&pSVar10->finalizeCount)
    ;
  }
  else if (local_32[0] != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x876,"(verifyFinalizeCount == 0)","verifyFinalizeCount == 0");
    if (!bVar6) {
LAB_00232aca:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar2 = 0;
  }
  return;
}

Assistant:

void SmallHeapBlockT<TBlockAttributes>::Verify(bool pendingDispose)
{
    ushort verifyFinalizeCount = 0;
    SmallHeapBlockBitVector tempFree;
    SmallHeapBlockBitVector *free = &tempFree;
    SmallHeapBlockBitVector tempPending;
    this->BuildFreeBitVector(free);
    Recycler * recycler = this->heapBucket->heapInfo->recycler;
    char * memBlock = this->GetAddress();
    uint objectBitDelta = this->GetObjectBitDelta();
    Recycler::VerifyCheck(!pendingDispose || this->IsAnyFinalizableBlock(),
        _u("Non-finalizable block shouldn't be disposing. May have corrupted block type."),
        this->GetAddress(), (void *)&this->heapBlockType);

    if (HasPendingDisposeObjects())
    {
        Assert(pendingDispose);

        // Pending object are not free yet, they don't have memory cleared.
        this->AsFinalizableBlock<TBlockAttributes>()->ForEachPendingDisposeObject([&](uint index) {

            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));

            tempPending.Set(bitIndex);

            // We are a pending dispose block, so the finalize count hasn't been update yet.
            // Including the pending objects in the finalize count
            verifyFinalizeCount++;
        });
    }

    for (uint i = 0; i < objectCount; i++)
    {
        if (free->Test(i * objectBitDelta))
        {
            if (!tempPending.Test(i * objectBitDelta))
            {
                char * nextFree = (char *)((FreeObject *)memBlock)->GetNext();
                Recycler::VerifyCheck(nextFree == nullptr
                    || (nextFree >= address && nextFree < this->GetEndAddress()
                    && free->Test(GetAddressBitIndex(nextFree))),
                    _u("SmallHeapBlock memory written to after freed"), memBlock, memBlock);
                Recycler::VerifyCheckFill(memBlock + sizeof(FreeObject), this->GetObjectSize() - sizeof(FreeObject));
            }
        }
        else
        {
            if (explicitFreeBits.Test(i * objectBitDelta))
            {
                char * nextFree = (char *)((FreeObject *)memBlock)->GetNext();

                HeapBlock* nextFreeHeapBlock = this;

                if (nextFree != nullptr)
                {
                    nextFreeHeapBlock = recycler->FindHeapBlock(nextFree);
                }

                Recycler::VerifyCheck(nextFree == nullptr
                    || (nextFree >= address && nextFree < this->GetEndAddress()
                    && explicitFreeBits.Test(GetAddressBitIndex(nextFree)))
                    || nextFreeHeapBlock->GetObjectSize(nextFree) == this->objectSize,
                    _u("SmallHeapBlock memory written to after freed"), memBlock, memBlock);
                recycler->VerifyCheckPadExplicitFreeList(memBlock, this->GetObjectSize());
            }
            else
            {
                recycler->VerifyCheckPad(memBlock, this->GetObjectSize());
            }

            if ((this->ObjectInfo(i) & FinalizeBit) != 0)
            {
                if (this->IsAnyFinalizableBlock())
                {
                    verifyFinalizeCount++;
                }
                else
                {
                    Recycler::VerifyCheck(false, _u("Non-Finalizable block should not have finalizable objects"),
                        this->GetAddress(), &this->ObjectInfo(i));
                }
            }

        }
        memBlock += this->GetObjectSize();
    }

    if (this->IsAnyFinalizableBlock())
    {
        Recycler::VerifyCheck(this->AsFinalizableBlock<TBlockAttributes>()->finalizeCount == verifyFinalizeCount,
            _u("SmallHeapBlock finalize count mismatch"), this->GetAddress(), &this->AsFinalizableBlock<TBlockAttributes>()->finalizeCount);
    }
    else
    {
        Assert(verifyFinalizeCount == 0);
    }
}